

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3EvalUpdateCounts(Fts3Expr *pExpr,int nCol)

{
  u32 *puVar1;
  u32 *puVar2;
  int iVar3;
  uint uVar4;
  ulong in_RAX;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  byte *pbVar9;
  undefined8 uStack_28;
  
  if (pExpr != (Fts3Expr *)0x0) {
    uStack_28 = in_RAX;
    do {
      if ((pExpr->pPhrase != (Fts3Phrase *)0x0) &&
         (pbVar9 = (byte *)(pExpr->pPhrase->doclist).pList, pbVar9 != (byte *)0x0)) {
        uStack_28 = uStack_28 & 0xffffffff;
        iVar3 = 0;
        do {
          bVar7 = *pbVar9;
          iVar5 = 0;
          if (1 < bVar7) {
            bVar8 = 0;
            do {
              iVar5 = iVar5 + (uint)(bVar8 == 0);
              bVar8 = bVar7 & 0x80;
              bVar7 = pbVar9[1];
              pbVar9 = pbVar9 + 1;
            } while ((bVar7 & 0xfe) != 0 || bVar8 != 0);
          }
          puVar2 = pExpr->aMI;
          puVar1 = puVar2 + (long)(iVar3 * 3) + 1;
          *puVar1 = *puVar1 + iVar5;
          puVar2 = puVar2 + (long)(iVar3 * 3) + 2;
          *puVar2 = (*puVar2 + 1) - (uint)(iVar5 == 0);
          if (*pbVar9 == 0) break;
          bVar7 = pbVar9[1];
          if ((char)bVar7 < '\0') {
            uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar9 + 1),(int *)((long)&uStack_28 + 4));
            uVar6 = (ulong)uVar4;
            iVar3 = uStack_28._4_4_;
          }
          else {
            uStack_28 = CONCAT44((int)(char)bVar7,(undefined4)uStack_28);
            uVar6 = 1;
            iVar3 = (int)(char)bVar7;
          }
          pbVar9 = pbVar9 + 1 + uVar6;
        } while (iVar3 < nCol);
      }
      fts3EvalUpdateCounts(pExpr->pLeft,nCol);
      pExpr = pExpr->pRight;
    } while (pExpr != (Fts3Expr *)0x0);
  }
  return;
}

Assistant:

static void fts3EvalUpdateCounts(Fts3Expr *pExpr, int nCol){
  if( pExpr ){
    Fts3Phrase *pPhrase = pExpr->pPhrase;
    if( pPhrase && pPhrase->doclist.pList ){
      int iCol = 0;
      char *p = pPhrase->doclist.pList;

      do{
        u8 c = 0;
        int iCnt = 0;
        while( 0xFE & (*p | c) ){
          if( (c&0x80)==0 ) iCnt++;
          c = *p++ & 0x80;
        }

        /* aMI[iCol*3 + 1] = Number of occurrences
        ** aMI[iCol*3 + 2] = Number of rows containing at least one instance
        */
        pExpr->aMI[iCol*3 + 1] += iCnt;
        pExpr->aMI[iCol*3 + 2] += (iCnt>0);
        if( *p==0x00 ) break;
        p++;
        p += fts3GetVarint32(p, &iCol);
      }while( iCol<nCol );
    }

    fts3EvalUpdateCounts(pExpr->pLeft, nCol);
    fts3EvalUpdateCounts(pExpr->pRight, nCol);
  }
}